

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec2.c
# Opt level: O2

bool_t ec2CreateLD(ec_o *ec,qr_o *f,octet *A,octet *B,void *stack)

{
  long lVar1;
  bool_t bVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  bool_t bVar7;
  
  bVar7 = 0;
  memSet(ec,'\0',0xb0);
  ec->d = 3;
  ec->f = f;
  ec->A = (word *)(ec + 1);
  ec->B = &ec[1].hdr.keep + f->n;
  bVar2 = (*f->from)((word *)(ec + 1),A,f,stack);
  if (bVar2 != 0) {
    bVar2 = (*ec->f->from)(ec->B,B,ec->f,stack);
    if (bVar2 != 0) {
      sVar3 = f->n;
      ec->base = ec->B + sVar3;
      ec->order = ec->B + sVar3 + f->n * 2;
      ec->froma = ec2FromALD;
      ec->toa = ec2ToALD;
      ec->neg = ec2NegLD;
      ec->add = ec2AddLD;
      ec->adda = ec2AddALD;
      ec->sub = ec2SubLD;
      ec->suba = ec2SubALD;
      ec->dbl = ec2DblLD;
      ec->dbla = ec2DblALD;
      lVar1 = f->deep + f->n * 8;
      sVar3 = ec2AddLD_deep(f->n,f->deep);
      sVar4 = ec2AddALD_deep(f->n,f->deep);
      sVar5 = ec2SubLD_deep(f->n,f->deep);
      sVar6 = ec2SubALD_deep(f->n,f->deep);
      sVar3 = utilMax(8,lVar1,lVar1,sVar3,sVar4,sVar5,sVar6,f->n * 0x10 + f->deep,f->deep + f->n * 8
                     );
      ec->deep = sVar3;
      (ec->hdr).keep = f->n * 0x28 + 0xb8;
      (ec->hdr).p_count = 6;
      (ec->hdr).o_count = 1;
      bVar7 = 1;
    }
  }
  return bVar7;
}

Assistant:

bool_t ec2CreateLD(ec_o* ec, const qr_o* f, const octet A[], const octet B[],
	void* stack)
{
	ASSERT(memIsValid(ec, sizeof(ec_o)));
	ASSERT(gf2IsOperable(f));
	ASSERT(memIsValid(A, f->no));
	ASSERT(memIsValid(B, f->no));
	// обнулить
	memSetZero(ec, sizeof(ec_o));
	// зафикисровать размерности
	ec->d = 3;
	// запомнить базовое поле
	ec->f = f;
	// сохранить коэффициенты
	ec->A = (word*)ec->descr;
	ec->B = ec->A + f->n;
	if (!qrFrom(ec->A, A, ec->f, stack) || !qrFrom(ec->B, B, ec->f, stack))
		return FALSE;
	// подготовить буферы для описания группы точек
	ec->base = ec->B + f->n;
	ec->order = ec->base + 2 * f->n;
	// настроить интерфейсы
	ec->froma = ec2FromALD;
	ec->toa = ec2ToALD;
	ec->neg = ec2NegLD;
	ec->add = ec2AddLD;
	ec->adda = ec2AddALD;
	ec->sub = ec2SubLD;
	ec->suba = ec2SubALD;
	ec->dbl = ec2DblLD;
	ec->dbla = ec2DblALD;
	ec->deep = utilMax(8,
		ec2ToALD_deep(f->n, f->deep),
		ec2NegLD_deep(f->n, f->deep),
		ec2AddLD_deep(f->n, f->deep),
		ec2AddALD_deep(f->n, f->deep),
		ec2SubLD_deep(f->n, f->deep),
		ec2SubALD_deep(f->n, f->deep),
		ec2DblLD_deep(f->n, f->deep),
		ec2DblALD_deep(f->n, f->deep));
	// настроить заголовок
	ec->hdr.keep = sizeof(ec_o) + O_OF_W(5 * f->n + 1);
	ec->hdr.p_count = 6;
	ec->hdr.o_count = 1;
	// все нормально
	return TRUE;
}